

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

uint32 __thiscall rw::StreamMemory::read8(StreamMemory *this,void *data,uint32 len)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  uint uVar4;
  
  iVar2 = (*(this->super_Stream)._vptr_Stream[7])();
  uVar4 = 0;
  if ((char)iVar2 == '\0') {
    uVar1 = this->position;
    uVar4 = this->length - uVar1;
    if (uVar1 + len <= this->length) {
      uVar4 = len;
    }
    memcpy(data,this->data + uVar1,(ulong)uVar4);
    uVar3 = 0xffffffff;
    if (uVar4 == len) {
      uVar3 = this->position + uVar4;
    }
    this->position = uVar3;
  }
  return uVar4;
}

Assistant:

uint32
StreamMemory::read8(void *data, uint32 len)
{
	if(this->eof())
		return 0;
	uint32 l = len;
	if(this->position+l > this->length)
		l = this->length-this->position;
	memcpy(data, &this->data[this->position], l);
	this->position += l;
	if(len != l)
		this->position = S_EOF;
	return l;
}